

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_txid.cpp
# Opt level: O2

void __thiscall Txid_TxidEqualsGetByte_Test::TestBody(Txid_TxidEqualsGetByte_Test *this)

{
  bool bVar1;
  char *in_R9;
  AssertHelper local_b0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  string local_a0;
  AssertionResult gtest_ar_;
  ByteData256 byte_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> list1;
  Txid txid;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&list1,0x20,(allocator_type *)&txid);
  list1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[2] = '\b';
  list1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[4] = '@';
  list1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[6] = ' ';
  cfd::core::ByteData256::ByteData256(&byte_data,&list1);
  cfd::core::Txid::Txid(&txid,&byte_data);
  cfd::core::Txid::GetData((ByteData *)&gtest_ar_,&txid);
  cfd::core::ByteData::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a0,
             (ByteData *)&gtest_ar_);
  bVar1 = std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a0,&list1)
  ;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = bVar1;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a0,(internal *)&gtest_ar_,(AssertionResult *)"is_equals","false","true",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_txid.cpp"
               ,0x48,local_a0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    std::__cxx11::string::~string((string *)&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  cfd::core::Txid::~Txid(&txid);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&byte_data);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&list1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

TEST(Txid, TxidEqualsGetByte) {
  std::vector<uint8_t> list1(32);
  list1[2] = 8;
  list1[4] = 64;
  list1[6] = 32;
  ByteData256 byte_data = ByteData256(list1);
  Txid txid = Txid(byte_data);
  bool is_equals = (txid.GetData().GetBytes() == list1);
  EXPECT_TRUE(is_equals);
}